

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

size_type __thiscall Catch::StringRef::numberOfCharacters(StringRef *this)

{
  size_type i;
  size_type sVar1;
  byte bVar2;
  size_type sVar3;
  
  sVar3 = this->m_size;
  for (sVar1 = 0; this->m_size != sVar1; sVar1 = sVar1 + 1) {
    bVar2 = ~this->m_start[sVar1];
    if ((bVar2 & 0xc0) == 0) {
      sVar3 = ((-1 - (ulong)((bVar2 & 0xe0) == 0)) + sVar3) - (ulong)((bVar2 & 0xf0) == 0);
    }
  }
  return sVar3;
}

Assistant:

auto StringRef::numberOfCharacters() const noexcept -> size_type {
        size_type noChars = m_size;
        // Make adjustments for uft encodings
        for( size_type i=0; i < m_size; ++i ) {
            char c = m_start[i];
            if( ( c & byte_2_lead ) == byte_2_lead ) {
                noChars--;
                if (( c & byte_3_lead ) == byte_3_lead )
                    noChars--;
                if( ( c & byte_4_lead ) == byte_4_lead )
                    noChars--;
            }
        }
        return noChars;
    }